

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.hpp
# Opt level: O2

void __thiscall BlockingWaitStrategy::~BlockingWaitStrategy(BlockingWaitStrategy *this)

{
  operator_delete(this);
  return;
}

Assistant:

int64_t Wait(int64_t index) {
            while (true) {
                int64_t current_cursor = status_on_shared_mem_->cursor.load() ;

                if( index > current_cursor ) {
                    struct timespec timeToWait;
                    struct timeval now;
                    gettimeofday(&now,NULL);
                  
                    timeToWait.tv_sec  = now.tv_sec;
                    timeToWait.tv_nsec = now.tv_usec * 1000;
                    timeToWait.tv_sec += 1;
                    //timeToWait.tv_nsec += 1000;

                    pthread_mutex_lock(&(status_on_shared_mem_->mutex_lock) );

                    pthread_cond_timedwait(& (status_on_shared_mem_->cond_var), 
                                           &(status_on_shared_mem_->mutex_lock),
                                           & timeToWait );

                    pthread_mutex_unlock(&(status_on_shared_mem_->mutex_lock));
                } else {
                    return current_cursor;
                }
            }//while
        }